

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_packets.c
# Opt level: O0

int main(int argc,char **args)

{
  undefined8 uVar1;
  light_pcapng_t *plVar2;
  light_pcapng_file_info *plVar3;
  long in_RSI;
  int in_EDI;
  int res;
  uint8_t *pkt_data;
  light_packet_header pkt_header;
  int index;
  light_pcapng_file_info *info;
  light_pcapng_t *pcapng;
  char *file;
  int i;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  light_boolean in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  uint local_70;
  uint8_t **in_stack_ffffffffffffff98;
  light_packet_header *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  ushort local_50;
  undefined8 local_48;
  short local_40;
  uint local_34;
  int local_14;
  
  for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
    uVar1 = *(undefined8 *)(in_RSI + (long)local_14 * 8);
    plVar2 = light_pcapng_open_read(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    if (plVar2 == (light_pcapng_t *)0x0) {
      fprintf(_stderr,"Unable to read pcapng: %s\n",uVar1);
    }
    else {
      plVar3 = light_pcang_get_file_info
                         ((light_pcapng_t *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      printf("file version is %d.%d\n",(ulong)plVar3->major_version,(ulong)plVar3->minor_version);
      if (plVar3->file_comment != (char *)0x0) {
        printf("file comment is: %s\n",plVar3->file_comment);
      }
      if (plVar3->os_desc != (char *)0x0) {
        printf("os is: %s\n",plVar3->os_desc);
      }
      if (plVar3->hardware_desc != (char *)0x0) {
        printf("hardware description is: %s\n",plVar3->hardware_desc);
      }
      if (plVar3->user_app_desc != (char *)0x0) {
        printf("user app is: %s\n",plVar3->user_app_desc);
      }
      local_34 = 1;
      while( true ) {
        in_stack_ffffffffffffff88 = (char *)0x0;
        in_stack_ffffffffffffff84 =
             light_get_next_packet
                       ((light_pcapng_t *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        if (in_stack_ffffffffffffff84 == LIGHT_FALSE) break;
        if (in_stack_ffffffffffffff88 != (char *)0x0) {
          in_stack_ffffffffffffff68 = SUB84(in_stack_ffffffffffffff98,0);
          in_stack_ffffffffffffff70 = SUB84(in_stack_ffffffffffffffa0,0);
          printf("packet #%d: orig_len=%d, cap_len=%d, iface_id=%d, data_link=%d, timestamp=%d.%06d"
                 ,(ulong)local_34,(ulong)in_stack_ffffffffffffffac,(ulong)in_stack_ffffffffffffffa8,
                 (ulong)local_70,(ulong)local_50);
          if (local_40 == 0) {
            printf("\n");
          }
          else {
            printf(", comment=\"%s\"\n",local_48);
          }
          local_34 = local_34 + 1;
        }
      }
      printf("interface count in file: %d\n",plVar3->interface_block_count);
      light_pcapng_close((light_pcapng_t *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng_t *pcapng = light_pcapng_open_read(file, LIGHT_FALSE);
		if (pcapng != NULL) {
			light_pcapng_file_info *info = light_pcang_get_file_info(pcapng);
			printf("file version is %d.%d\n", info->major_version, info->minor_version);
			if (info->file_comment != NULL)
				printf("file comment is: %s\n", info->file_comment);
			if (info->os_desc != NULL)
				printf("os is: %s\n", info->os_desc);
			if (info->hardware_desc != NULL)
				printf("hardware description is: %s\n", info->hardware_desc);
			if (info->user_app_desc != NULL)
				printf("user app is: %s\n", info->user_app_desc);

			int index = 1;

			while (1) {
				light_packet_header pkt_header;
				const uint8_t *pkt_data = NULL;
				int res = 0;

				res = light_get_next_packet(pcapng, &pkt_header, &pkt_data);
				if (!res)
					break;

				if (pkt_data != NULL) {
					printf("packet #%d: orig_len=%d, cap_len=%d, iface_id=%d, data_link=%d, timestamp=%d.%06d",
							index,
							pkt_header.original_length,
							pkt_header.captured_length,
							pkt_header.interface_id,
							pkt_header.data_link,
							(int)pkt_header.timestamp.tv_sec,
							(int)pkt_header.timestamp.tv_usec);
					if (pkt_header.comment_length > 0)
						printf(", comment=\"%s\"\n", pkt_header.comment);
					else
						printf("\n");

					index++;
				}
			}

			printf("interface count in file: %d\n", info->interface_block_count);

			light_pcapng_close(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	return 0;
}